

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseAlignOpt(WastParser *this,uint32_t *out_align)

{
  Location loc;
  bool bVar1;
  Result result;
  const_iterator s;
  const_iterator end;
  size_type sVar2;
  const_pointer pcVar3;
  undefined8 in_R9;
  undefined1 local_70 [8];
  string_view sv;
  Token token;
  uint32_t *out_align_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,AlignEqNat);
  if (bVar1) {
    Consume((Token *)&sv.size_,this);
    _local_70 = Token::text((Token *)&sv.size_);
    s = string_view::begin((string_view *)local_70);
    end = string_view::end((string_view *)local_70);
    result = ParseInt32(s,end,out_align,UnsignedOnly);
    bVar1 = Failed(result);
    if (bVar1) {
      sVar2 = string_view::length((string_view *)local_70);
      pcVar3 = string_view::data((string_view *)local_70);
      loc.filename.size_ = (size_type)token.loc.filename.data_;
      loc.filename.data_ = (char *)sv.size_;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           token.loc.filename.size_;
      loc.field_1._8_8_ = token.loc.field_1.field_1.offset;
      Error(this,loc,"invalid alignment \"%.*s\"",sVar2 & 0xffffffff,pcVar3,token.loc.filename.size_
            ,in_R9);
    }
    bVar1 = anon_unknown_1::IsPowerOfTwo(*out_align);
    if (!bVar1) {
      Error(this,0x339007);
    }
    this_local._7_1_ = true;
  }
  else {
    *out_align = 0xffffffff;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseAlignOpt(uint32_t* out_align) {
  WABT_TRACE(ParseAlignOpt);
  if (PeekMatch(TokenType::AlignEqNat)) {
    Token token = Consume();
    string_view sv = token.text();
    if (Failed(ParseInt32(sv.begin(), sv.end(), out_align,
                          ParseIntType::UnsignedOnly))) {
      Error(token.loc, "invalid alignment \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    if (!IsPowerOfTwo(*out_align)) {
      Error(token.loc, "alignment must be power-of-two");
    }

    return true;
  } else {
    *out_align = WABT_USE_NATURAL_ALIGNMENT;
    return false;
  }
}